

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall
cs::compiler_type::preprocessor::preprocessor
          (preprocessor *this,context_t *context,compiler_type *compiler,
          deque<char,_std::allocator<char>_> *char_buff,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens,charset encoding)

{
  _Elt_pointer pcVar1;
  compile_error *this_00;
  int iVar2;
  _Elt_pointer pcVar3;
  char cVar4;
  _Elt_pointer __x;
  allocator local_85;
  charset encoding_local;
  string *local_80;
  deque<char,_std::allocator<char>_> *local_78;
  _Map_pointer local_70;
  string *local_68;
  compiler_type *local_60;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *local_58;
  string local_50;
  
  this->last_line_num = 1;
  this->line_num = 1;
  this->is_annotation = false;
  this->is_command = false;
  this->multi_line = false;
  this->empty_buff = true;
  this->empty_line = true;
  local_78 = &this->buff;
  encoding_local = encoding;
  local_60 = compiler;
  local_58 = tokens;
  std::_Deque_base<char,_std::allocator<char>_>::_Deque_base
            (&local_78->super__Deque_base<char,_std::allocator<char>_>);
  local_68 = &this->command;
  (this->command)._M_dataplus._M_p = (pointer)&(this->command).field_2;
  (this->command)._M_string_length = 0;
  (this->command).field_2._M_local_buf[0] = '\0';
  local_80 = &this->line;
  (this->line)._M_dataplus._M_p = (pointer)&(this->line).field_2;
  (this->line)._M_string_length = 0;
  (this->line).field_2._M_local_buf[0] = '\0';
  __x = (char_buff->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
        _M_start._M_cur;
  pcVar3 = (char_buff->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
           super__Deque_impl_data._M_start._M_last;
  local_70 = (char_buff->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
             super__Deque_impl_data._M_start._M_node;
  pcVar1 = (char_buff->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  do {
    if (__x == pcVar1) {
      process_endline(this,context,local_60,local_58,&encoding_local);
      if (this->multi_line == true) {
        this_00 = (compile_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)&local_50,"Lack of the @end command.",&local_85);
        compile_error::compile_error(this_00,&local_50);
        __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
      }
      return;
    }
    cVar4 = *__x;
    iVar2 = (int)cVar4;
    if (iVar2 == 10) {
      process_endline(this,context,local_60,local_58,&encoding_local);
    }
    else if (this->is_annotation == false) {
      if (this->is_command == true) {
        iVar2 = isspace(iVar2);
        cVar4 = (char)local_68;
        if (iVar2 == 0) {
LAB_002e6e4c:
          std::__cxx11::string::push_back(cVar4);
        }
      }
      else if ((this->empty_line == true) && (iVar2 = isspace(iVar2), iVar2 == 0)) {
        if (cVar4 == '@') {
          this->is_command = true;
        }
        else {
          if (cVar4 != '#') {
            this->empty_buff = false;
            this->empty_line = false;
            goto LAB_002e6e2f;
          }
          this->is_annotation = true;
        }
      }
      else {
LAB_002e6e2f:
        if (this->empty_buff == false) {
          std::deque<char,_std::allocator<char>_>::push_back(local_78,__x);
          cVar4 = (char)local_80;
          goto LAB_002e6e4c;
        }
      }
    }
    __x = __x + 1;
    if (__x == pcVar3) {
      __x = local_70[1];
      local_70 = local_70 + 1;
      pcVar3 = __x + 0x200;
    }
  } while( true );
}

Assistant:

explicit preprocessor(const context_t &context, compiler_type &compiler, const std::deque<char> &char_buff,
		                      std::deque<token_base *> &tokens, charset encoding)
		{
			for (auto &ch: char_buff) {
				if (ch == '\n') {
					process_endline(context, compiler, tokens, encoding);
					continue;
				}
				if (is_annotation)
					continue;
				if (is_command) {
					if (!std::isspace(ch))
						command.push_back(ch);
					continue;
				}
				if (empty_line && !std::isspace(ch)) {
					switch (ch) {
					case '#':
						is_annotation = true;
						continue;
					case '@':
						is_command = true;
						continue;
					default:
						empty_buff = false;
						empty_line = false;
						break;
					}
				}
				if (!empty_buff) {
					buff.push_back(ch);
					line.push_back(ch);
				}
			}
			process_endline(context, compiler, tokens, encoding);
			if (multi_line)
				throw compile_error("Lack of the @end command.");
		}